

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

bool __thiscall csv::CSVReader::read_csv(CSVReader *this,size_t bytes)

{
  IBasicCSVParser *pIVar1;
  
  internals::ThreadSafeDeque<csv::CSVRow>::notify_all
            ((this->records)._M_t.
             super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
             _M_head_impl);
  ((this->parser)._M_t.
   super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
   ._M_t.
   super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
   .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl)->_records =
       (this->records)._M_t.
       super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
       .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>._M_head_impl;
  pIVar1 = (this->parser)._M_t.
           super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
           ._M_t.
           super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
           .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IBasicCSVParser[2])(pIVar1,bytes);
  if (this->header_trimmed == false) {
    trim_header(this);
  }
  internals::ThreadSafeDeque<csv::CSVRow>::kill_all
            ((this->records)._M_t.
             super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
             _M_head_impl);
  return true;
}

Assistant:

CSV_INLINE bool CSVReader::read_csv(size_t bytes) {
        // Tell read_row() to listen for CSV rows
        this->records->notify_all();

        this->parser->set_output(*this->records);
        this->parser->next(bytes);

        if (!this->header_trimmed) {
            this->trim_header();
        }

        // Tell read_row() to stop waiting
        this->records->kill_all();

        return true;
    }